

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav__ieee_to_s32(drwav_int32 *pOut,drwav_uint8 *pIn,size_t totalSampleCount,
                       uint bytesPerSample)

{
  int in_ECX;
  size_t in_RDX;
  double *in_RSI;
  drwav_int32 *in_RDI;
  
  if (in_ECX == 4) {
    drwav_f32_to_s32(in_RDI,(float *)in_RSI,in_RDX);
  }
  else if (in_ECX == 8) {
    drwav_f64_to_s32(in_RDI,in_RSI,in_RDX);
  }
  else {
    memset(in_RDI,0,in_RDX << 2);
  }
  return;
}

Assistant:

static void drwav__ieee_to_s32(drwav_int32* pOut, const drwav_uint8* pIn, size_t totalSampleCount, unsigned int bytesPerSample)
{
    if (bytesPerSample == 4) {
        drwav_f32_to_s32(pOut, (const float*)pIn, totalSampleCount);
        return;
    } else if (bytesPerSample == 8) {
        drwav_f64_to_s32(pOut, (const double*)pIn, totalSampleCount);
        return;
    } else {
        /* Only supporting 32- and 64-bit float. Output silence in all other cases. Contributions welcome for 16-bit float. */
        DRWAV_ZERO_MEMORY(pOut, totalSampleCount * sizeof(*pOut));
        return;
    }
}